

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

TimeZoneGenericNames * __thiscall
icu_63::TimeZoneFormat::getTimeZoneGenericNames(TimeZoneFormat *this,UErrorCode *status)

{
  TimeZoneGenericNames *pTVar1;
  TimeZoneFormat *nonConstThis;
  
  if (U_ZERO_ERROR < *status) {
    return (TimeZoneGenericNames *)0x0;
  }
  umtx_lock_63((UMutex *)gLock);
  if (this->fTimeZoneGenericNames == (TimeZoneGenericNames *)0x0) {
    pTVar1 = TimeZoneGenericNames::createInstance(&this->fLocale,status);
    this->fTimeZoneGenericNames = pTVar1;
  }
  umtx_unlock_63((UMutex *)gLock);
  return this->fTimeZoneGenericNames;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }